

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
wallet::anon_unknown_5::WalletImpl::getAddress
          (WalletImpl *this,CTxDestination *dest,string *name,isminetype *is_mine,
          AddressPurpose *purpose)

{
  isminetype iVar1;
  CAddressBookData *this_00;
  _Storage<wallet::AddressPurpose,_true> _Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  unique_lock<std::recursive_mutex> local_68;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_68,
             &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->cs_wallet,"m_wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/interfaces.cpp"
             ,199,false);
  this_00 = CWallet::FindAddressBookEntry
                      ((this->m_wallet).
                       super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,dest,
                       false);
  if (this_00 != (CAddressBookData *)0x0) {
    if (name != (string *)0x0) {
      CAddressBookData::GetLabel_abi_cxx11_(&local_58,this_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,&local_58
                );
      std::__cxx11::string::~string((string *)&local_58);
    }
    if (is_mine != (isminetype *)0x0 || purpose != (AddressPurpose *)0x0) {
      iVar1 = CWallet::IsMine((this->m_wallet).
                              super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              ,dest);
      if (is_mine != (isminetype *)0x0) {
        *is_mine = iVar1;
      }
      if (purpose != (AddressPurpose *)0x0) {
        if ((this_00->purpose).super__Optional_base<wallet::AddressPurpose,_true,_true>._M_payload.
            super__Optional_payload_base<wallet::AddressPurpose>._M_engaged == false) {
          _Var2._M_value._1_3_ = 0;
          _Var2._M_value._0_1_ = iVar1 == ISMINE_NO;
        }
        else {
          _Var2 = (this_00->purpose).super__Optional_base<wallet::AddressPurpose,_true,_true>.
                  _M_payload.super__Optional_payload_base<wallet::AddressPurpose>._M_payload;
        }
        *purpose = (AddressPurpose)_Var2;
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00 != (CAddressBookData *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool getAddress(const CTxDestination& dest,
        std::string* name,
        isminetype* is_mine,
        AddressPurpose* purpose) override
    {
        LOCK(m_wallet->cs_wallet);
        const auto& entry = m_wallet->FindAddressBookEntry(dest, /*allow_change=*/false);
        if (!entry) return false; // addr not found
        if (name) {
            *name = entry->GetLabel();
        }
        std::optional<isminetype> dest_is_mine;
        if (is_mine || purpose) {
            dest_is_mine = m_wallet->IsMine(dest);
        }
        if (is_mine) {
            *is_mine = *dest_is_mine;
        }
        if (purpose) {
            // In very old wallets, address purpose may not be recorded so we derive it from IsMine
            *purpose = entry->purpose.value_or(*dest_is_mine ? AddressPurpose::RECEIVE : AddressPurpose::SEND);
        }
        return true;
    }